

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O1

void cf_gf128_mul(uint32_t *x,uint32_t *y,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  cf_gf128 V;
  undefined8 local_58;
  undefined8 uStack_50;
  uint32_t *local_40;
  uint32_t *local_38;
  
  local_58 = *(undefined8 *)y;
  uStack_50 = *(undefined8 *)(y + 2);
  uVar7 = 0;
  uVar4 = 0;
  uVar6 = 0;
  uVar3 = 0;
  uVar8 = 0;
  local_40 = out;
  local_38 = x;
  do {
    uVar1 = 0;
    uVar2 = 0;
    uVar5 = 0;
    if ((local_38[uVar7 >> 5] >> (~uVar7 & 0x1f) & 1) != 0) {
      uVar1 = (uint)local_58;
      uVar2 = local_58._4_4_;
      uVar5 = (uint)uStack_50;
    }
    uVar6 = uVar6 ^ uVar5;
    uVar3 = uVar3 ^ uVar2;
    uVar8 = uVar8 ^ uVar1;
    uVar4 = uVar4 ^ -(uint)((local_38[uVar7 >> 5] >> (~uVar7 & 0x1f) & 1) != 0) & uStack_50._4_4_;
    cf_gf128_double_le((uint32_t *)&local_58,(uint32_t *)&local_58);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x80);
  *local_40 = uVar8;
  local_40[1] = uVar3;
  local_40[2] = uVar6;
  local_40[3] = uVar4;
  return;
}

Assistant:

void cf_gf128_mul(const cf_gf128 x, const cf_gf128 y, cf_gf128 out)
{
#if CF_TIME_SIDE_CHANNEL_PROTECTION
  cf_gf128 zero = { 0 };
#endif
 
  /* Z_0 = 0^128
   * V_0 = Y */ 
  cf_gf128 Z, V;
  memset(Z, 0, sizeof Z);
  memcpy(V, y, sizeof V);

  int i;
  for (i = 0; i < 128; i++)
  {
    uint32_t word = x[i >> 5];
    uint8_t bit = (word >> (31 - (i & 31))) & 1;

#if CF_TIME_SIDE_CHANNEL_PROTECTION
    select_xor128(Z, zero, V, bit);
#else
    if (bit)
      xor_words(Z, V, 4);
#endif

    cf_gf128_double_le(V, V);
  }

  memcpy(out, Z, sizeof Z);
}